

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

counting_iterator __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<fmt::v6::internal::counting_iterator>
          (float_writer<wchar_t> *this,counting_iterator it)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  counting_iterator cVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  _Distance __n;
  ulong uVar16;
  bool bVar17;
  
  uVar11 = this->num_digits_;
  uVar12 = this->exp_;
  lVar15 = (long)(int)uVar11;
  uVar8 = uVar12 + uVar11;
  uVar1 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar1 & 0xff) == 1) {
    lVar14 = (this->specs_).precision - lVar15;
    if ((int)lVar14 < 1) {
      lVar14 = 0;
    }
    bVar17 = (uVar1 >> 0x15 & 1) == 0;
    if (bVar17) {
      lVar14 = 0;
    }
    lVar13 = it.count_ - (bVar17 && (int)uVar11 < 2);
    pcVar5 = this->digits_ + ~(ulong)this->digits_ + lVar13 + 2 + lVar15;
    if ((int)uVar11 < 2) {
      pcVar5 = (char *)(lVar13 + 2);
    }
    uVar8 = uVar8 - 1;
    uVar11 = -uVar8;
    if (0 < (int)uVar8) {
      uVar11 = uVar8;
    }
    pcVar6 = pcVar5 + lVar14 + 3;
    if (uVar11 < 1000) {
      pcVar6 = pcVar5 + lVar14 + 2;
    }
    pcVar6 = pcVar6 + 1;
    if (uVar11 < 100) {
      pcVar6 = pcVar5 + lVar14 + 2;
    }
  }
  else {
    if ((int)uVar12 < 0) {
      if ((int)uVar8 < 1) {
        iVar9 = -uVar8;
        if (uVar11 == 0) {
          iVar10 = (this->specs_).precision;
          iVar3 = iVar9;
          if (SBORROW4(iVar10,iVar9) != (int)(iVar10 + uVar8) < 0) {
            iVar3 = iVar10;
          }
          if (iVar10 < 0) {
            iVar3 = iVar9;
          }
          iVar9 = iVar3;
          bVar17 = (uVar1 >> 0x15 & 1) == 0;
          uVar11 = 0;
        }
        else {
          bVar17 = (uVar1 & 0x200000) == 0;
          if (0 < (int)uVar11 && (char)((uVar1 & 0x200000) >> 0x15) == '\0') {
            bVar17 = true;
            do {
              if (this->digits_[(ulong)uVar11 - 1] != '0') goto LAB_00182d3e;
              bVar2 = 1 < (int)uVar11;
              uVar11 = uVar11 - 1;
            } while (bVar2);
            uVar11 = 0;
          }
        }
LAB_00182d3e:
        if ((bVar17) && (uVar11 == 0 && iVar9 == 0)) {
          return (counting_iterator)(it.count_ + 1);
        }
        sVar4 = it.count_ + 3 + (ulong)(iVar9 - 1);
        if (iVar9 < 1) {
          sVar4 = it.count_ + 2;
        }
        cVar7.count_ = (long)(int)uVar11 + sVar4;
        if ((int)uVar11 < 1) {
          cVar7.count_ = sVar4;
        }
      }
      else {
        pcVar6 = this->digits_;
        uVar16 = (ulong)uVar8;
        pcVar5 = pcVar6 + uVar16 + (it.count_ - (long)pcVar6);
        if ((uVar1 >> 0x15 & 1) == 0) {
          uVar12 = uVar11 - 1;
          if ((int)uVar8 < (int)(uVar11 - 1)) {
            uVar12 = uVar8;
          }
          do {
            if (pcVar6[lVar15 + -1] != '0') {
              uVar12 = (uint)lVar15;
              break;
            }
            lVar15 = lVar15 + -1;
          } while ((long)uVar16 < lVar15);
          pcVar6 = pcVar6 + (it.count_ - (long)pcVar6) + (long)(int)uVar12;
          if ((int)uVar12 <= (int)uVar8) {
            pcVar6 = pcVar5;
          }
          return (counting_iterator)(size_t)(pcVar6 + (uVar12 != uVar8));
        }
        iVar9 = (this->specs_).precision;
        iVar10 = iVar9 - uVar11;
        cVar7.count_ = (size_t)(pcVar5 + (lVar15 - uVar16) + 1);
        if (iVar10 != 0 && (int)uVar11 <= iVar9) {
          if (0 < iVar10) {
            cVar7.count_ = (size_t)(pcVar5 + (ulong)(iVar10 - 1) + (lVar15 - uVar16) + 2);
          }
          return (counting_iterator)cVar7.count_;
        }
      }
      return (counting_iterator)cVar7.count_;
    }
    cVar7.count_ = lVar15 + it.count_;
    if ((int)uVar11 < 1) {
      cVar7.count_ = it.count_;
    }
    sVar4 = cVar7.count_ + uVar12;
    iVar9 = (this->specs_).precision;
    if ((iVar9 < 0 | (byte)(uVar1 >> 0x15) & 1) != 1) {
      return (counting_iterator)sVar4;
    }
    if (iVar9 - uVar8 != 0 && (int)uVar8 <= iVar9) {
      return (counting_iterator)(sVar4 + (iVar9 - uVar8) + 1);
    }
    pcVar6 = (char *)(sVar4 - ((uVar1 & 0xff) == 2));
  }
  return (counting_iterator)((long)pcVar6 + 2);
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }